

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

nn_hash_item * nn_hash_get(nn_hash *self,uint32_t key)

{
  uint32_t uVar1;
  nn_hash_item *pnVar2;
  uint uVar3;
  nn_hash_item *local_40;
  nn_hash_item *item;
  nn_list_item *it;
  uint32_t slot;
  uint32_t key_local;
  nn_hash *self_local;
  
  uVar1 = nn_hash_key(key);
  uVar3 = uVar1 % self->slots;
  item = (nn_hash_item *)nn_list_begin(self->array + uVar3);
  while( true ) {
    pnVar2 = (nn_hash_item *)nn_list_end(self->array + uVar3);
    if (item == pnVar2) {
      return (nn_hash_item *)0x0;
    }
    if (item == (nn_hash_item *)0x0) {
      local_40 = (nn_hash_item *)0x0;
    }
    else {
      local_40 = (nn_hash_item *)&item[-1].list.prev;
    }
    if (local_40->key == key) break;
    item = (nn_hash_item *)nn_list_next(self->array + uVar3,(nn_list_item *)item);
  }
  return local_40;
}

Assistant:

struct nn_hash_item *nn_hash_get (struct nn_hash *self, uint32_t key)
{
    uint32_t slot;
    struct nn_list_item *it;
    struct nn_hash_item *item;

    slot = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [slot]);
          it != nn_list_end (&self->array [slot]);
          it = nn_list_next (&self->array [slot], it)) {
        item = nn_cont (it, struct nn_hash_item, list);
        if (item->key == key)
            return item;
    }

    return NULL;
}